

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_nex.cpp
# Opt level: O0

void dirNexClose(void)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *badValueMessage;
  pointer puVar4;
  size_t __n;
  size_t sVar5;
  size_t write;
  size_t read;
  FILE *local_30;
  FILE *appendF;
  fullpath_ref_t appendIn;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_10;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> copyBuffer;
  
  if (nex.canAppend) {
    SNexFile::updateIfAheadFirstBankSave(&nex);
    std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
    unique_ptr<std::default_delete<unsigned_char[]>,void>
              ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)&local_10);
    do {
      iVar2 = SkipBlanks(&lp);
      if (iVar2 != 0) break;
      appendF = (FILE *)GetInputFile(&lp);
      uVar3 = std::filesystem::__cxx11::path::has_filename();
      if ((uVar3 & 1) != 0) {
        local_30 = (FILE *)0x0;
        local_30 = (FILE *)SJ_fopen((path *)appendF,"rb");
        if (local_30 == (FILE *)0x0) {
          badValueMessage = (char *)std::__cxx11::string::c_str();
          Error("[SAVENEX] Error opening append file",badValueMessage,SUPPRESS);
        }
        else {
          bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_10);
          if (!bVar1) {
            std::make_unique<unsigned_char[]>((size_t)&read);
            std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
                      (&local_10,
                       (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&read);
            std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                      ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&read);
          }
          do {
            puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                               (&local_10);
            __n = fread(puVar4,1,0x4000,local_30);
            if (__n != 0) {
              puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                                 (&local_10);
              sVar5 = fwrite(puVar4,1,__n,(FILE *)nex.f);
              if (sVar5 != __n) {
                Error("[SAVENEX] writing append data failed",(char *)0x0,FATAL);
              }
            }
            iVar2 = feof(local_30);
          } while (iVar2 == 0);
          fclose(local_30);
        }
      }
      bVar1 = comma(&lp);
    } while (bVar1);
    SNexFile::finalizeFile(&nex);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&local_10);
  }
  else {
    Error("[SAVENEX] NEX file is not open",(char *)0x0,SUPPRESS);
  }
  return;
}

Assistant:

static void dirNexClose() {
	if (!nex.canAppend) {
		Error("[SAVENEX] NEX file is not open", NULL, SUPPRESS);
		return;
	}
	// update V1.3 banksOffset in case there was no bank stored at all (before appending binary data!)
	nex.updateIfAheadFirstBankSave();
	// read CLOSE command arguments and try to append the proposed files (if some were provided)
	static constexpr int copyBufSize = 0x4000;
	std::unique_ptr<byte[]> copyBuffer;		// Lazily allocated buffer (if needed)
	while (!SkipBlanks(lp)) {
		fullpath_ref_t appendIn = GetInputFile(lp);
		if (appendIn.full.has_filename()) {	// some append file requested, try to copy its content at tail of NEX
			FILE* appendF = nullptr;
			if (!FOPEN_ISOK(appendF, appendIn.full, "rb")) {
				Error("[SAVENEX] Error opening append file", appendIn.str.c_str(), SUPPRESS);
			} else {
				if (!copyBuffer) copyBuffer = std::make_unique<byte[]>(copyBufSize);
				do {
					const size_t read = fread(copyBuffer.get(), 1, copyBufSize, appendF);
					if (read) {
						const size_t write = fwrite(copyBuffer.get(), 1, read, nex.f);
						if (write != read) Error("[SAVENEX] writing append data failed", NULL, FATAL);
					}
				} while (!feof(appendF));
				fclose(appendF);
			}
		}
		if (!comma(lp)) break;
	}
	// finalize the NEX file (refresh the header data and close it)
	nex.finalizeFile();
}